

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_memory.h
# Opt level: O0

void absl::container_internal::slot_type<S2Shape*,std::vector<S2Shape*,std::allocator<S2Shape*>>>::
     move<std::allocator<std::pair<S2Shape*const,std::vector<S2Shape*,std::allocator<S2Shape*>>>>>
               (allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
                *alloc,slot_type<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>
                       *src,
               slot_type<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_> *dest)

{
  slot_type<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_> *dest_local;
  slot_type<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_> *src_local;
  allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
  *alloc_local;
  
  std::pair<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>::operator=
            ((pair<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_> *)&dest->value,
             (type)&src->value);
  return;
}

Assistant:

static void move(Allocator* alloc, slot_type* src, slot_type* dest) {
    if (kMutableKeys::value) {
      dest->mutable_value = std::move(src->mutable_value);
    } else {
      absl::allocator_traits<Allocator>::destroy(*alloc, &dest->value);
      absl::allocator_traits<Allocator>::construct(*alloc, &dest->value,
                                                   std::move(src->value));
    }
  }